

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateInfoFree(HelicsFederateInfo fedInfo)

{
  FederateInfo *this;
  
  this = (FederateInfo *)0x0;
  if ((fedInfo != (HelicsFederateInfo)0x0) && (*(int *)((long)fedInfo + 0x48) == 0x6bfbbce1)) {
    this = (FederateInfo *)fedInfo;
  }
  if (this != (FederateInfo *)0x0) {
    this->uniqueKey = 0;
    helics::FederateInfo::~FederateInfo(this);
    operator_delete(this,0x1a8);
    return;
  }
  return;
}

Assistant:

void helicsFederateInfoFree(HelicsFederateInfo fedInfo)
{
    auto* info = getFedInfo(fedInfo, nullptr);
    if (info == nullptr) {
        // fprintf(stderr, "The HelicsFederateInfo object is not valid\n");
        return;
    }
    info->uniqueKey = 0;
    delete info;
}